

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateSendCommand(HelicsFederate fed,char *target,char *command,HelicsError *err)

{
  Federate *this;
  string_view target_00;
  string_view commandStr;
  allocator<char> local_6a;
  allocator<char> local_69;
  char *local_68;
  size_t local_60;
  char *local_48;
  size_t local_40;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (target == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_48,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,target,&local_69);
    }
    if (command == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_68,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,command,&local_6a);
    }
    target_00._M_str = local_48;
    target_00._M_len = local_40;
    commandStr._M_str = local_68;
    commandStr._M_len = local_60;
    helics::Federate::sendCommand(this,target_00,commandStr,HELICS_SEQUENCING_MODE_FAST);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void helicsFederateSendCommand(HelicsFederate fed, const char* target, const char* command, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    fedObj->sendCommand(AS_STRING(target), AS_STRING(command));
}